

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Frodo1344.c
# Opt level: O3

uint32_t Hacl_Frodo1344_crypto_kem_enc(uint8_t *ct,uint8_t *ss,uint8_t *pk)

{
  uint16_t *puVar1;
  ushort uVar2;
  ushort uVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  uint16_t uVar11;
  uint16_t uVar12;
  uint16_t uVar13;
  uint16_t uVar14;
  uint16_t uVar15;
  uint16_t uVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  undefined1 auVar21 [12];
  undefined1 auVar22 [12];
  undefined1 auVar23 [12];
  undefined1 auVar24 [12];
  undefined1 auVar25 [12];
  uint32_t i0_2;
  short *psVar26;
  uint32_t i1;
  long lVar27;
  uint16_t *puVar28;
  short *psVar29;
  ulong uVar30;
  uint8_t *seed;
  ulong uVar31;
  uint16_t *__s;
  ushort uVar32;
  ulong uVar33;
  undefined4 *puVar34;
  int iVar35;
  short *psVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  uint16_t sample0_2;
  uint16_t uVar40;
  long lVar41;
  ulong uVar42;
  uint16_t res_1;
  long lVar43;
  ulong uVar44;
  uint32_t i0;
  long lVar45;
  uint8_t *__s_00;
  uint32_t i0_1;
  undefined1 in_XMM2 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined4 uVar61;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  uint16_t a_matrix [1806336];
  uint8_t r [43136];
  short local_fe98 [10752];
  undefined4 local_aa98;
  ushort auStack_aa94 [2];
  uint16_t b_matrix [10752];
  uint16_t bp_matrix [10752];
  uint8_t pkh_mu [64];
  undefined8 uStack_228;
  uint8_t seed_se_k [64];
  short asStack_1e0 [4];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  uint8_t auStack_168 [8];
  uint8_t coins [32];
  uint16_t mu_encode [64];
  uint16_t v_matrix [64];
  undefined1 auVar52 [16];
  uint uVar53;
  uint uVar59;
  uint uVar60;
  uint uVar62;
  
  coins[8] = '\0';
  coins[9] = '\0';
  coins[10] = '\0';
  coins[0xb] = '\0';
  coins[0xc] = '\0';
  coins[0xd] = '\0';
  coins[0xe] = '\0';
  coins[0xf] = '\0';
  coins[0x10] = '\0';
  coins[0x11] = '\0';
  coins[0x12] = '\0';
  coins[0x13] = '\0';
  coins[0x14] = '\0';
  coins[0x15] = '\0';
  coins[0x16] = '\0';
  coins[0x17] = '\0';
  auStack_168[0] = '\0';
  auStack_168[1] = '\0';
  auStack_168[2] = '\0';
  auStack_168[3] = '\0';
  auStack_168[4] = '\0';
  auStack_168[5] = '\0';
  auStack_168[6] = '\0';
  auStack_168[7] = '\0';
  coins[0] = '\0';
  coins[1] = '\0';
  coins[2] = '\0';
  coins[3] = '\0';
  coins[4] = '\0';
  coins[5] = '\0';
  coins[6] = '\0';
  coins[7] = '\0';
  v_matrix._120_8_ = ss;
  randombytes_(0x20,auStack_168);
  seed_se_k[0x28] = '\0';
  seed_se_k[0x29] = '\0';
  seed_se_k[0x2a] = '\0';
  seed_se_k[0x2b] = '\0';
  seed_se_k[0x2c] = '\0';
  seed_se_k[0x2d] = '\0';
  seed_se_k[0x2e] = '\0';
  seed_se_k[0x2f] = '\0';
  seed_se_k[0x30] = '\0';
  seed_se_k[0x31] = '\0';
  seed_se_k[0x32] = '\0';
  seed_se_k[0x33] = '\0';
  seed_se_k[0x34] = '\0';
  seed_se_k[0x35] = '\0';
  seed_se_k[0x36] = '\0';
  seed_se_k[0x37] = '\0';
  seed_se_k[0x18] = '\0';
  seed_se_k[0x19] = '\0';
  seed_se_k[0x1a] = '\0';
  seed_se_k[0x1b] = '\0';
  seed_se_k[0x1c] = '\0';
  seed_se_k[0x1d] = '\0';
  seed_se_k[0x1e] = '\0';
  seed_se_k[0x1f] = '\0';
  seed_se_k[0x20] = '\0';
  seed_se_k[0x21] = '\0';
  seed_se_k[0x22] = '\0';
  seed_se_k[0x23] = '\0';
  seed_se_k[0x24] = '\0';
  seed_se_k[0x25] = '\0';
  seed_se_k[0x26] = '\0';
  seed_se_k[0x27] = '\0';
  seed_se_k[8] = '\0';
  seed_se_k[9] = '\0';
  seed_se_k[10] = '\0';
  seed_se_k[0xb] = '\0';
  seed_se_k[0xc] = '\0';
  seed_se_k[0xd] = '\0';
  seed_se_k[0xe] = '\0';
  seed_se_k[0xf] = '\0';
  seed_se_k[0x10] = '\0';
  seed_se_k[0x11] = '\0';
  seed_se_k[0x12] = '\0';
  seed_se_k[0x13] = '\0';
  seed_se_k[0x14] = '\0';
  seed_se_k[0x15] = '\0';
  seed_se_k[0x16] = '\0';
  seed_se_k[0x17] = '\0';
  uStack_228 = 0;
  seed_se_k[0] = '\0';
  seed_se_k[1] = '\0';
  seed_se_k[2] = '\0';
  seed_se_k[3] = '\0';
  seed_se_k[4] = '\0';
  seed_se_k[5] = '\0';
  seed_se_k[6] = '\0';
  seed_se_k[7] = '\0';
  pkh_mu[0x28] = '\0';
  pkh_mu[0x29] = '\0';
  pkh_mu[0x2a] = '\0';
  pkh_mu[0x2b] = '\0';
  pkh_mu[0x2c] = '\0';
  pkh_mu[0x2d] = '\0';
  pkh_mu[0x2e] = '\0';
  pkh_mu[0x2f] = '\0';
  pkh_mu[0x30] = '\0';
  pkh_mu[0x31] = '\0';
  pkh_mu[0x32] = '\0';
  pkh_mu[0x33] = '\0';
  pkh_mu[0x34] = '\0';
  pkh_mu[0x35] = '\0';
  pkh_mu[0x36] = '\0';
  pkh_mu[0x37] = '\0';
  pkh_mu[0x18] = '\0';
  pkh_mu[0x19] = '\0';
  pkh_mu[0x1a] = '\0';
  pkh_mu[0x1b] = '\0';
  pkh_mu[0x1c] = '\0';
  pkh_mu[0x1d] = '\0';
  pkh_mu[0x1e] = '\0';
  pkh_mu[0x1f] = '\0';
  pkh_mu[0x20] = '\0';
  pkh_mu[0x21] = '\0';
  pkh_mu[0x22] = '\0';
  pkh_mu[0x23] = '\0';
  pkh_mu[0x24] = '\0';
  pkh_mu[0x25] = '\0';
  pkh_mu[0x26] = '\0';
  pkh_mu[0x27] = '\0';
  pkh_mu[8] = '\0';
  pkh_mu[9] = '\0';
  pkh_mu[10] = '\0';
  pkh_mu[0xb] = '\0';
  pkh_mu[0xc] = '\0';
  pkh_mu[0xd] = '\0';
  pkh_mu[0xe] = '\0';
  pkh_mu[0xf] = '\0';
  pkh_mu[0x10] = '\0';
  pkh_mu[0x11] = '\0';
  pkh_mu[0x12] = '\0';
  pkh_mu[0x13] = '\0';
  pkh_mu[0x14] = '\0';
  pkh_mu[0x15] = '\0';
  pkh_mu[0x16] = '\0';
  pkh_mu[0x17] = '\0';
  bp_matrix[0x29fc] = 0;
  bp_matrix[0x29fd] = 0;
  bp_matrix[0x29fe] = 0;
  bp_matrix[0x29ff] = 0;
  pkh_mu[0] = '\0';
  pkh_mu[1] = '\0';
  pkh_mu[2] = '\0';
  pkh_mu[3] = '\0';
  pkh_mu[4] = '\0';
  pkh_mu[5] = '\0';
  pkh_mu[6] = '\0';
  pkh_mu[7] = '\0';
  Hacl_Hash_SHA3_shake256((uint8_t *)(bp_matrix + 0x29fc),0x20,pk,0x5410);
  pkh_mu[0x28] = coins[8];
  pkh_mu[0x29] = coins[9];
  pkh_mu[0x2a] = coins[10];
  pkh_mu[0x2b] = coins[0xb];
  pkh_mu[0x2c] = coins[0xc];
  pkh_mu[0x2d] = coins[0xd];
  pkh_mu[0x2e] = coins[0xe];
  pkh_mu[0x2f] = coins[0xf];
  pkh_mu[0x30] = coins[0x10];
  pkh_mu[0x31] = coins[0x11];
  pkh_mu[0x32] = coins[0x12];
  pkh_mu[0x33] = coins[0x13];
  pkh_mu[0x34] = coins[0x14];
  pkh_mu[0x35] = coins[0x15];
  pkh_mu[0x36] = coins[0x16];
  pkh_mu[0x37] = coins[0x17];
  pkh_mu[0x18] = auStack_168[0];
  pkh_mu[0x19] = auStack_168[1];
  pkh_mu[0x1a] = auStack_168[2];
  pkh_mu[0x1b] = auStack_168[3];
  pkh_mu[0x1c] = auStack_168[4];
  pkh_mu[0x1d] = auStack_168[5];
  pkh_mu[0x1e] = auStack_168[6];
  pkh_mu[0x1f] = auStack_168[7];
  pkh_mu[0x20] = coins[0];
  pkh_mu[0x21] = coins[1];
  pkh_mu[0x22] = coins[2];
  pkh_mu[0x23] = coins[3];
  pkh_mu[0x24] = coins[4];
  pkh_mu[0x25] = coins[5];
  pkh_mu[0x26] = coins[6];
  pkh_mu[0x27] = coins[7];
  Hacl_Hash_SHA3_shake256((uint8_t *)&uStack_228,0x40,(uint8_t *)(bp_matrix + 0x29fc),0x40);
  lVar45 = 0;
  memset(a_matrix + 0x1b8ffc,0,0xa880);
  pkh_mu[0x38] = 0x96;
  stack0xfffffffffffffda9 = uStack_228;
  Hacl_Hash_SHA3_shake256((uint8_t *)(a_matrix + 0x1b8ffc),0xa880,pkh_mu + 0x38,0x21);
  Lib_Memzero0_memzero0(pkh_mu + 0x38,0x21);
  psVar26 = local_fe98;
  memset(psVar26,0,0x5400);
  do {
    lVar27 = 0;
    do {
      lVar43 = lVar27 + lVar45 * 0x540;
      lVar41 = 0;
      iVar35 = 0;
      do {
        iVar35 = iVar35 + (((uint)*(ushort *)((long)Hacl_Impl_Frodo_Params_cdf_table1344 + lVar41) -
                            (uint)(a_matrix[lVar43 + 0x1b8ffc] >> 1) & 0xffff) >> 0xf);
        lVar41 = lVar41 + 2;
      } while (lVar41 != 0xc);
      uVar32 = a_matrix[lVar43 + 0x1b8ffc] & 1;
      local_fe98[lVar43] = ((ushort)iVar35 ^ -uVar32) + uVar32;
      lVar27 = lVar27 + 1;
    } while (lVar27 != 0x540);
    lVar45 = lVar45 + 1;
  } while (lVar45 != 8);
  __s_00 = r + 0xa878;
  lVar45 = 0;
  memset(__s_00,0,0x5400);
  do {
    lVar27 = 0;
    do {
      lVar43 = lVar27 + lVar45 * 0x540;
      lVar41 = 0;
      iVar35 = 0;
      do {
        iVar35 = iVar35 + (((uint)*(ushort *)((long)Hacl_Impl_Frodo_Params_cdf_table1344 + lVar41) -
                            (uint)(*(ushort *)(r + lVar43 * 2 + 0x53f8) >> 1) & 0xffff) >> 0xf);
        lVar41 = lVar41 + 2;
      } while (lVar41 != 0xc);
      uVar32 = *(ushort *)(r + lVar43 * 2 + 0x53f8) & 1;
      *(ushort *)(r + lVar43 * 2 + 0xa878) = ((ushort)iVar35 ^ -uVar32) + uVar32;
      lVar27 = lVar27 + 1;
    } while (lVar27 != 0x540);
    lVar45 = lVar45 + 1;
  } while (lVar45 != 8);
  local_178 = (undefined1  [16])0x0;
  local_188 = (undefined1  [16])0x0;
  local_198 = (undefined1  [16])0x0;
  local_1a8 = (undefined1  [16])0x0;
  local_1b8 = (undefined1  [16])0x0;
  local_1c8 = (undefined1  [16])0x0;
  local_1d8 = (undefined1  [16])0x0;
  stack0xfffffffffffffe18 = (undefined1  [16])0x0;
  lVar45 = 0;
  do {
    puVar28 = (uint16_t *)(lVar45 * 8);
    lVar27 = 0;
    do {
      lVar43 = 0;
      iVar35 = 0;
      do {
        iVar35 = iVar35 + (((uint)*(ushort *)((long)Hacl_Impl_Frodo_Params_cdf_table1344 + lVar43) -
                            (uint)(*(ushort *)(r + (lVar27 + (long)puVar28) * 2 + 43000) >> 1) &
                           0xffff) >> 0xf);
        lVar43 = lVar43 + 2;
      } while (lVar43 != 0xc);
      uVar32 = *(ushort *)(r + (lVar27 + (long)puVar28) * 2 + 43000) & 1;
      *(ushort *)(seed_se_k + (lVar27 + (long)puVar28) * 2 + 0x38) =
           ((ushort)iVar35 ^ -uVar32) + uVar32;
      lVar27 = lVar27 + 1;
    } while (lVar27 != 8);
    lVar45 = lVar45 + 1;
  } while (lVar45 != 8);
  __s = b_matrix + 0x29fc;
  lVar45 = 0;
  memset(__s,0,0x5400);
  memset(&stack0xffffffffffc6e4e8,0,0x372000);
  Hacl_Impl_Frodo_Params_frodo_gen_matrix
            ((Spec_Frodo_Params_frodo_gen_a)pk,(uint32_t)&stack0xffffffffffc6e4e8,seed,puVar28);
  do {
    lVar27 = 0;
    psVar29 = (short *)&stack0xffffffffffc6e4e8;
    do {
      lVar43 = 0;
      uVar40 = 0;
      psVar36 = psVar29;
      do {
        uVar40 = uVar40 + *psVar36 * psVar26[lVar43];
        lVar43 = lVar43 + 1;
        psVar36 = psVar36 + 0x540;
      } while (lVar43 != 0x540);
      bp_matrix[lVar45 * 0x540 + lVar27 + -4] = uVar40;
      lVar27 = lVar27 + 1;
      psVar29 = psVar29 + 1;
    } while (lVar27 != 0x540);
    lVar45 = lVar45 + 1;
    psVar26 = psVar26 + 0x540;
  } while (lVar45 != 8);
  lVar45 = 0;
  do {
    lVar27 = 0;
    do {
      psVar26 = (short *)(__s_00 + lVar27 * 2);
      sVar4 = psVar26[1];
      sVar5 = psVar26[2];
      sVar6 = psVar26[3];
      sVar7 = psVar26[4];
      sVar8 = psVar26[5];
      sVar9 = psVar26[6];
      sVar10 = psVar26[7];
      puVar28 = __s + lVar27;
      uVar40 = puVar28[1];
      uVar11 = puVar28[2];
      uVar12 = puVar28[3];
      uVar13 = puVar28[4];
      uVar14 = puVar28[5];
      uVar15 = puVar28[6];
      uVar16 = puVar28[7];
      puVar1 = __s + lVar27;
      *puVar1 = *psVar26 + *puVar28;
      puVar1[1] = sVar4 + uVar40;
      puVar1[2] = sVar5 + uVar11;
      puVar1[3] = sVar6 + uVar12;
      puVar1[4] = sVar7 + uVar13;
      puVar1[5] = sVar8 + uVar14;
      puVar1[6] = sVar9 + uVar15;
      puVar1[7] = sVar10 + uVar16;
      lVar27 = lVar27 + 8;
    } while (lVar27 != 0x540);
    lVar45 = lVar45 + 1;
    __s_00 = __s_00 + 0xa80;
    __s = __s + 0x540;
  } while (lVar45 != 8);
  lVar45 = 0;
  do {
    uVar42 = (ulong)*(ushort *)((long)b_matrix + lVar45 + 0x53fe);
    uVar31 = (ulong)*(ushort *)((long)bp_matrix + lVar45 + 6);
    uVar44 = (ulong)*(uint *)((long)b_matrix + lVar45 + 0x53f8) << 0x30;
    uVar37 = (ulong)*(ushort *)((long)b_matrix + lVar45 + 0x53fa) << 0x20;
    uVar30 = (ulong)(uint)(*(int *)((long)b_matrix + lVar45 + 0x53fc) << 0x10);
    uVar38 = (ulong)*(uint *)((long)bp_matrix + lVar45) << 0x30;
    uVar33 = (ulong)*(ushort *)((long)bp_matrix + lVar45 + 2) << 0x20;
    uVar39 = (ulong)(uint)(*(int *)((long)bp_matrix + lVar45 + 4) << 0x10);
    *(ulong *)(ct + lVar45) =
         uVar44 >> 0x38 | (uVar44 & 0xff000000000000) >> 0x28 | (uVar37 & 0xff0000000000) >> 0x18 |
         (uVar37 & 0xff00000000) >> 8 | (uVar30 & 0xff000000) << 8 | (uVar30 & 0xff0000) << 0x18 |
         (uVar42 & 0xff00) << 0x28 | uVar42 << 0x38;
    *(ulong *)(ct + lVar45 + 8) =
         uVar38 >> 0x38 | (uVar38 & 0xff000000000000) >> 0x28 | (uVar33 & 0xff0000000000) >> 0x18 |
         (uVar33 & 0xff00000000) >> 8 | (uVar39 & 0xff000000) << 8 | (uVar39 & 0xff0000) << 0x18 |
         (uVar31 & 0xff00) << 0x28 | uVar31 << 0x38;
    lVar45 = lVar45 + 0x10;
  } while (lVar45 != 0x5400);
  v_matrix[0x34] = 0;
  v_matrix[0x35] = 0;
  v_matrix[0x36] = 0;
  v_matrix[0x37] = 0;
  v_matrix[0x38] = 0;
  v_matrix[0x39] = 0;
  v_matrix[0x3a] = 0;
  v_matrix[0x3b] = 0;
  v_matrix[0x2c] = 0;
  v_matrix[0x2d] = 0;
  v_matrix[0x2e] = 0;
  v_matrix[0x2f] = 0;
  v_matrix[0x30] = 0;
  v_matrix[0x31] = 0;
  v_matrix[0x32] = 0;
  v_matrix[0x33] = 0;
  v_matrix[0x24] = 0;
  v_matrix[0x25] = 0;
  v_matrix[0x26] = 0;
  v_matrix[0x27] = 0;
  v_matrix[0x28] = 0;
  v_matrix[0x29] = 0;
  v_matrix[0x2a] = 0;
  v_matrix[0x2b] = 0;
  v_matrix[0x1c] = 0;
  v_matrix[0x1d] = 0;
  v_matrix[0x1e] = 0;
  v_matrix[0x1f] = 0;
  v_matrix[0x20] = 0;
  v_matrix[0x21] = 0;
  v_matrix[0x22] = 0;
  v_matrix[0x23] = 0;
  v_matrix[0x14] = 0;
  v_matrix[0x15] = 0;
  v_matrix[0x16] = 0;
  v_matrix[0x17] = 0;
  v_matrix[0x18] = 0;
  v_matrix[0x19] = 0;
  v_matrix[0x1a] = 0;
  v_matrix[0x1b] = 0;
  v_matrix[0xc] = 0;
  v_matrix[0xd] = 0;
  v_matrix[0xe] = 0;
  v_matrix[0xf] = 0;
  v_matrix[0x10] = 0;
  v_matrix[0x11] = 0;
  v_matrix[0x12] = 0;
  v_matrix[0x13] = 0;
  v_matrix[4] = 0;
  v_matrix[5] = 0;
  v_matrix[6] = 0;
  v_matrix[7] = 0;
  v_matrix[8] = 0;
  v_matrix[9] = 0;
  v_matrix[10] = 0;
  v_matrix[0xb] = 0;
  stack0xffffffffffffff38 = (undefined1  [16])0x0;
  lVar45 = 0;
  memset(&local_aa98,0,0x5400);
  do {
    lVar27 = *(long *)(pk + lVar45 + 0x10);
    uVar30 = *(ulong *)(pk + lVar45 + 0x18);
    uVar3 = (ushort)((ulong)lVar27 >> 0x28);
    uVar2 = (ushort)((ulong)lVar27 >> 0x18);
    uVar32 = (ushort)((ulong)lVar27 >> 8);
    *(uint *)((long)&local_aa98 + lVar45) =
         CONCAT22(uVar2 & 0xff | uVar32 & 0xff00,
                  uVar32 & 0xff | (ushort)((ulong)(lVar27 << 0x38) >> 0x30));
    *(ushort *)((long)auStack_aa94 + lVar45) = uVar3 & 0xff | uVar2 & 0xff00;
    *(ushort *)((long)b_matrix + lVar45 + -2) =
         (ushort)(byte)((ulong)lVar27 >> 0x38) | uVar3 & 0xff00;
    *(ulong *)((long)b_matrix + lVar45) =
         ((uVar30 & 0xff00) << 0x28 | uVar30 << 0x38) >> 0x30 |
         (((uVar30 & 0xff000000) << 8 | (uVar30 & 0xff0000) << 0x18) >> 0x20) << 0x10 |
         (((uVar30 & 0xff0000000000) >> 0x18 | (uVar30 & 0xff00000000) >> 8) >> 0x10) << 0x20 |
         (uVar30 >> 0x38 | (uVar30 & 0xff000000000000) >> 0x28) << 0x30;
    lVar45 = lVar45 + 0x10;
  } while (lVar45 != 0x5400);
  psVar26 = local_fe98;
  lVar45 = 0;
  do {
    lVar27 = 0;
    puVar34 = &local_aa98;
    do {
      lVar43 = 0;
      uVar40 = 0;
      do {
        uVar40 = uVar40 + *(short *)(puVar34 + lVar43 * 2) * *(short *)((long)psVar26 + lVar43);
        lVar43 = lVar43 + 2;
      } while (lVar43 != 0xa80);
      v_matrix[lVar45 * 8 + lVar27 + -4] = uVar40;
      lVar27 = lVar27 + 1;
      puVar34 = (undefined4 *)((long)puVar34 + 2);
    } while (lVar27 != 8);
    lVar45 = lVar45 + 1;
    psVar26 = psVar26 + 0x540;
  } while (lVar45 != 8);
  lVar45 = 0;
  do {
    sVar4 = *(short *)(seed_se_k + lVar45 + 0x3a);
    sVar5 = *(short *)(seed_se_k + lVar45 + 0x3c);
    sVar6 = *(short *)(seed_se_k + lVar45 + 0x3e);
    sVar7 = *(short *)((long)asStack_1e0 + lVar45);
    sVar8 = *(short *)((long)asStack_1e0 + lVar45 + 2);
    sVar9 = *(short *)((long)asStack_1e0 + lVar45 + 4);
    sVar10 = *(short *)(local_1d8 + lVar45 + -2);
    sVar17 = *(short *)((long)v_matrix + lVar45);
    sVar18 = *(short *)((long)v_matrix + lVar45 + 2);
    sVar19 = *(short *)((long)v_matrix + lVar45 + 4);
    sVar20 = *(short *)((long)v_matrix + lVar45 + 6);
    *(short *)((long)mu_encode + lVar45 + 0x78) =
         *(short *)(seed_se_k + lVar45 + 0x38) + *(short *)((long)mu_encode + lVar45 + 0x78);
    *(short *)((long)mu_encode + lVar45 + 0x7a) =
         sVar4 + *(short *)((long)mu_encode + lVar45 + 0x7a);
    *(short *)((long)mu_encode + lVar45 + 0x7c) =
         sVar5 + *(short *)((long)mu_encode + lVar45 + 0x7c);
    *(short *)((long)mu_encode + lVar45 + 0x7e) =
         sVar6 + *(short *)((long)mu_encode + lVar45 + 0x7e);
    *(short *)((long)v_matrix + lVar45) = sVar7 + sVar17;
    *(short *)((long)v_matrix + lVar45 + 2) = sVar8 + sVar18;
    *(short *)((long)v_matrix + lVar45 + 4) = sVar9 + sVar19;
    *(short *)((long)v_matrix + lVar45 + 6) = sVar10 + sVar20;
    lVar45 = lVar45 + 0x10;
  } while (lVar45 != 0x80);
  mu_encode[0x34] = 0;
  mu_encode[0x35] = 0;
  mu_encode[0x36] = 0;
  mu_encode[0x37] = 0;
  mu_encode[0x38] = 0;
  mu_encode[0x39] = 0;
  mu_encode[0x3a] = 0;
  mu_encode[0x3b] = 0;
  mu_encode[0x2c] = 0;
  mu_encode[0x2d] = 0;
  mu_encode[0x2e] = 0;
  mu_encode[0x2f] = 0;
  mu_encode[0x30] = 0;
  mu_encode[0x31] = 0;
  mu_encode[0x32] = 0;
  mu_encode[0x33] = 0;
  mu_encode[0x24] = 0;
  mu_encode[0x25] = 0;
  mu_encode[0x26] = 0;
  mu_encode[0x27] = 0;
  mu_encode[0x28] = 0;
  mu_encode[0x29] = 0;
  mu_encode[0x2a] = 0;
  mu_encode[0x2b] = 0;
  mu_encode[0x1c] = 0;
  mu_encode[0x1d] = 0;
  mu_encode[0x1e] = 0;
  mu_encode[0x1f] = 0;
  mu_encode[0x20] = 0;
  mu_encode[0x21] = 0;
  mu_encode[0x22] = 0;
  mu_encode[0x23] = 0;
  mu_encode[0x14] = 0;
  mu_encode[0x15] = 0;
  mu_encode[0x16] = 0;
  mu_encode[0x17] = 0;
  mu_encode[0x18] = 0;
  mu_encode[0x19] = 0;
  mu_encode[0x1a] = 0;
  mu_encode[0x1b] = 0;
  mu_encode[0xc] = 0;
  mu_encode[0xd] = 0;
  mu_encode[0xe] = 0;
  mu_encode[0xf] = 0;
  mu_encode[0x10] = 0;
  mu_encode[0x11] = 0;
  mu_encode[0x12] = 0;
  mu_encode[0x13] = 0;
  mu_encode[4] = 0;
  mu_encode[5] = 0;
  mu_encode[6] = 0;
  mu_encode[7] = 0;
  mu_encode[8] = 0;
  mu_encode[9] = 0;
  mu_encode[10] = 0;
  mu_encode[0xb] = 0;
  stack0xfffffffffffffeb8 = (undefined1  [16])0x0;
  lVar45 = 0;
  do {
    auVar56 = *(undefined1 (*) [16])(coins + lVar45 + -8);
    auVar46 = pshuflw(in_XMM2,auVar56,0xe8);
    auVar46 = pshufhw(auVar46,auVar46,0xe8);
    auVar50._4_4_ = auVar46._8_4_;
    auVar50._0_4_ = auVar46._0_4_;
    auVar50._8_4_ = auVar46._8_4_;
    auVar50._12_4_ = auVar46._12_4_;
    auVar47 = psllw(auVar50,4);
    auVar54._0_12_ = auVar47._0_12_;
    auVar54._12_2_ = auVar47._6_2_;
    auVar54._14_2_ = auVar46._10_2_;
    auVar64._12_4_ = auVar54._12_4_;
    auVar64._0_10_ = auVar47._0_10_;
    auVar64._10_2_ = auVar46._8_2_;
    auVar48._10_6_ = auVar64._10_6_;
    auVar48._0_8_ = auVar47._0_8_;
    auVar48._8_2_ = auVar47._4_2_;
    auVar49._8_8_ = auVar48._8_8_;
    auVar49._6_2_ = auVar46._2_2_;
    auVar49._4_2_ = auVar47._2_2_;
    auVar49._0_2_ = auVar47._0_2_;
    auVar49._2_2_ = auVar46._0_2_;
    auVar46 = psllw(auVar50,0xc);
    auVar54 = psllw(auVar50,8);
    auVar54 = auVar54 & _DAT_001dc0a0;
    auVar52._0_12_ = auVar46._0_12_;
    auVar52._12_2_ = auVar46._6_2_;
    auVar52._14_2_ = auVar54._6_2_;
    auVar51._12_4_ = auVar52._12_4_;
    auVar51._0_10_ = auVar46._0_10_;
    auVar51._10_2_ = auVar54._4_2_;
    auVar47._10_6_ = auVar51._10_6_;
    auVar47._0_8_ = auVar46._0_8_;
    auVar47._8_2_ = auVar46._4_2_;
    auVar21._4_8_ = auVar47._8_8_;
    auVar21._2_2_ = auVar54._2_2_;
    auVar21._0_2_ = auVar46._2_2_;
    uVar53 = auVar56._0_4_;
    auVar55._0_4_ = uVar53 >> 4;
    uVar59 = auVar56._4_4_;
    auVar55._4_4_ = uVar59 >> 4;
    uVar60 = auVar56._8_4_;
    uVar62 = auVar56._12_4_;
    auVar55._8_4_ = uVar60 >> 4;
    auVar55._12_4_ = uVar62 >> 4;
    auVar56 = pshuflw(auVar55,auVar55,0xe8);
    auVar56 = pshufhw(auVar56,auVar56,0xe8);
    uVar61 = auVar56._8_4_;
    auVar57._0_10_ = (unkuint10)CONCAT44(uVar61,uVar61) << 0x20;
    auVar63._0_4_ = uVar53 >> 8;
    auVar63._4_4_ = uVar59 >> 8;
    auVar63._8_4_ = uVar60 >> 8;
    auVar63._12_4_ = uVar62 >> 8;
    auVar64 = pshuflw(auVar63,auVar63,0xe8);
    auVar64 = pshufhw(auVar64,auVar64,0xe8);
    auVar24._8_2_ = auVar56._10_2_;
    auVar24._0_8_ = CONCAT44(uVar61,uVar61);
    auVar24._10_2_ = auVar64._10_2_;
    auVar57._12_4_ = auVar24._8_4_;
    auVar57._10_2_ = auVar64._8_2_;
    auVar22._4_2_ = auVar56._8_2_;
    auVar22._0_4_ = uVar61;
    auVar22._6_6_ = auVar57._10_6_;
    auVar58._8_8_ = auVar22._4_8_;
    auVar58._6_2_ = auVar64._2_2_;
    auVar58._4_2_ = auVar56._2_2_;
    auVar58._0_2_ = auVar56._0_2_;
    auVar58._2_2_ = auVar64._0_2_;
    auVar65._0_4_ = uVar53 >> 0xc;
    auVar65._4_4_ = uVar59 >> 0xc;
    auVar65._8_4_ = uVar60 >> 0xc;
    auVar65._12_4_ = uVar62 >> 0xc;
    auVar56 = pshuflw(auVar65,auVar65,0xe8);
    auVar64 = pshufhw(auVar56,auVar56,0xe8);
    uVar61 = auVar64._8_4_;
    auVar66._0_10_ = (unkuint10)CONCAT44(uVar61,uVar61) << 0x20;
    auVar56._0_4_ = (int)uVar53 >> 0x10;
    auVar56._4_4_ = (int)uVar59 >> 0x10;
    auVar56._8_4_ = (int)uVar60 >> 0x10;
    auVar56._12_4_ = (int)uVar62 >> 0x10;
    auVar56 = packssdw(auVar56,auVar56);
    auVar25._8_2_ = auVar64._10_2_;
    auVar25._0_8_ = CONCAT44(uVar61,uVar61);
    auVar25._10_2_ = auVar56._6_2_;
    auVar66._12_4_ = auVar25._8_4_;
    auVar66._10_2_ = auVar56._4_2_;
    auVar23._4_2_ = auVar64._8_2_;
    auVar23._0_4_ = uVar61;
    auVar23._6_6_ = auVar66._10_6_;
    auVar67._8_8_ = auVar23._4_8_;
    auVar67._6_2_ = auVar56._2_2_;
    auVar67._4_2_ = auVar64._2_2_;
    auVar67._0_2_ = auVar64._0_2_;
    auVar67._2_2_ = auVar56._0_2_;
    auVar49 = auVar49 & _DAT_001dc0b0;
    auVar67 = auVar67 & _DAT_001dc0b0;
    auVar58 = auVar58 & _DAT_001dc0b0;
    in_XMM2._12_4_ = auVar49._12_4_;
    in_XMM2._4_4_ = in_XMM2._12_4_;
    in_XMM2._0_4_ = in_XMM2._12_4_;
    in_XMM2._8_4_ = in_XMM2._12_4_;
    *(undefined4 *)(mu_encode + lVar45 * 2 + 0x14) = auVar51._12_4_;
    *(undefined4 *)(mu_encode + lVar45 * 2 + 0x16) = in_XMM2._12_4_;
    *(int *)(mu_encode + lVar45 * 2 + 0x18) = auVar58._12_4_;
    *(int *)(mu_encode + lVar45 * 2 + 0x1a) = auVar67._12_4_;
    *(int *)(mu_encode + lVar45 * 2 + 0xc) = auVar47._8_4_;
    *(int *)(mu_encode + lVar45 * 2 + 0xe) = auVar49._8_4_;
    *(int *)(mu_encode + lVar45 * 2 + 0x10) = auVar58._8_4_;
    *(int *)(mu_encode + lVar45 * 2 + 0x12) = auVar67._8_4_;
    *(int *)(mu_encode + lVar45 * 2 + 4) = auVar21._0_4_;
    *(int *)(mu_encode + lVar45 * 2 + 6) = auVar49._4_4_;
    *(int *)(mu_encode + lVar45 * 2 + 8) = auVar58._4_4_;
    *(int *)(mu_encode + lVar45 * 2 + 10) = auVar67._4_4_;
    *(uint *)(mu_encode + lVar45 * 2 + -4) = CONCAT22(auVar54._0_2_,auVar46._0_2_);
    *(int *)(mu_encode + lVar45 * 2 + -2) = auVar49._0_4_;
    *(int *)(mu_encode + lVar45 * 2) = auVar58._0_4_;
    *(int *)(mu_encode + lVar45 * 2 + 2) = auVar67._0_4_;
    lVar45 = lVar45 + 0x10;
  } while (lVar45 != 0x20);
  lVar45 = 0;
  do {
    sVar4 = *(short *)(coins + lVar45 + 0x1a);
    sVar5 = *(short *)(coins + lVar45 + 0x1c);
    sVar6 = *(short *)(coins + lVar45 + 0x1e);
    sVar7 = *(short *)((long)mu_encode + lVar45 + 2);
    sVar8 = *(short *)((long)mu_encode + lVar45 + 4);
    sVar9 = *(short *)((long)mu_encode + lVar45 + 6);
    sVar10 = *(short *)((long)v_matrix + lVar45);
    sVar17 = *(short *)((long)v_matrix + lVar45 + 2);
    sVar18 = *(short *)((long)v_matrix + lVar45 + 4);
    sVar19 = *(short *)((long)v_matrix + lVar45 + 6);
    *(short *)((long)mu_encode + lVar45 + 0x78) =
         *(short *)(coins + lVar45 + 0x18) + *(short *)((long)mu_encode + lVar45 + 0x78);
    *(short *)((long)mu_encode + lVar45 + 0x7a) =
         sVar4 + *(short *)((long)mu_encode + lVar45 + 0x7a);
    *(short *)((long)mu_encode + lVar45 + 0x7c) =
         sVar5 + *(short *)((long)mu_encode + lVar45 + 0x7c);
    *(short *)((long)mu_encode + lVar45 + 0x7e) =
         sVar6 + *(short *)((long)mu_encode + lVar45 + 0x7e);
    *(short *)((long)v_matrix + lVar45) = *(short *)((long)mu_encode + lVar45) + sVar10;
    *(short *)((long)v_matrix + lVar45 + 2) = sVar7 + sVar17;
    *(short *)((long)v_matrix + lVar45 + 4) = sVar8 + sVar18;
    *(short *)((long)v_matrix + lVar45 + 6) = sVar9 + sVar19;
    lVar45 = lVar45 + 0x10;
  } while (lVar45 != 0x80);
  Lib_Memzero0_memzero0(coins + 0x18,0x80);
  lVar45 = 0;
  do {
    uVar42 = (ulong)*(ushort *)((long)mu_encode + lVar45 + 0x7e);
    uVar31 = (ulong)*(ushort *)((long)v_matrix + lVar45 + 6);
    uVar44 = (ulong)*(uint *)((long)mu_encode + lVar45 + 0x78) << 0x30;
    uVar37 = (ulong)*(ushort *)((long)mu_encode + lVar45 + 0x7a) << 0x20;
    uVar30 = (ulong)(uint)(*(int *)((long)mu_encode + lVar45 + 0x7c) << 0x10);
    uVar38 = (ulong)*(uint *)((long)v_matrix + lVar45) << 0x30;
    uVar33 = (ulong)*(ushort *)((long)v_matrix + lVar45 + 2) << 0x20;
    uVar39 = (ulong)(uint)(*(int *)((long)v_matrix + lVar45 + 4) << 0x10);
    *(ulong *)(ct + lVar45 + 0x5400) =
         uVar44 >> 0x38 | (uVar44 & 0xff000000000000) >> 0x28 | (uVar37 & 0xff0000000000) >> 0x18 |
         (uVar37 & 0xff00000000) >> 8 | (uVar30 & 0xff000000) << 8 | (uVar30 & 0xff0000) << 0x18 |
         (uVar42 & 0xff00) << 0x28 | uVar42 << 0x38;
    *(ulong *)(ct + lVar45 + 0x5408) =
         uVar38 >> 0x38 | (uVar38 & 0xff000000000000) >> 0x28 | (uVar33 & 0xff0000000000) >> 0x18 |
         (uVar33 & 0xff00000000) >> 8 | (uVar39 & 0xff000000) << 8 | (uVar39 & 0xff0000) << 0x18 |
         (uVar31 & 0xff00) << 0x28 | uVar31 << 0x38;
    lVar45 = lVar45 + 0x10;
  } while (lVar45 != 0x80);
  Lib_Memzero0_memzero0(mu_encode + 0x3c,0x80);
  Lib_Memzero0_memzero0(local_fe98,0x5400);
  Lib_Memzero0_memzero0(r + 0xa878,0x5400);
  Lib_Memzero0_memzero0(seed_se_k + 0x38,0x80);
  memcpy(&stack0xffffffffffc69048,ct,0x5480);
  Hacl_Hash_SHA3_shake256((uint8_t *)v_matrix._120_8_,0x20,&stack0xffffffffffc69048,0x54a0);
  Lib_Memzero0_memzero0(&stack0xffffffffffc69048,0x54a0);
  Lib_Memzero0_memzero0(&uStack_228,0x40);
  Lib_Memzero0_memzero0(auStack_168,0x20);
  return 0;
}

Assistant:

uint32_t Hacl_Frodo1344_crypto_kem_enc(uint8_t *ct, uint8_t *ss, uint8_t *pk)
{
  uint8_t coins[32U] = { 0U };
  randombytes_(32U, coins);
  uint8_t seed_se_k[64U] = { 0U };
  uint8_t pkh_mu[64U] = { 0U };
  Hacl_Hash_SHA3_shake256(pkh_mu, 32U, pk, 21520U);
  memcpy(pkh_mu + 32U, coins, 32U * sizeof (uint8_t));
  Hacl_Hash_SHA3_shake256(seed_se_k, 64U, pkh_mu, 64U);
  uint8_t *seed_se = seed_se_k;
  uint8_t *k = seed_se_k + 32U;
  uint8_t *seed_a = pk;
  uint8_t *b = pk + 16U;
  uint16_t sp_matrix[10752U] = { 0U };
  uint16_t ep_matrix[10752U] = { 0U };
  uint16_t epp_matrix[64U] = { 0U };
  uint8_t r[43136U] = { 0U };
  uint8_t shake_input_seed_se[33U] = { 0U };
  shake_input_seed_se[0U] = 0x96U;
  memcpy(shake_input_seed_se + 1U, seed_se, 32U * sizeof (uint8_t));
  Hacl_Hash_SHA3_shake256(r, 43136U, shake_input_seed_se, 33U);
  Lib_Memzero0_memzero(shake_input_seed_se, 33U, uint8_t, void *);
  Hacl_Impl_Frodo_Sample_frodo_sample_matrix1344(8U, 1344U, r, sp_matrix);
  Hacl_Impl_Frodo_Sample_frodo_sample_matrix1344(8U, 1344U, r + 21504U, ep_matrix);
  Hacl_Impl_Frodo_Sample_frodo_sample_matrix1344(8U, 8U, r + 43008U, epp_matrix);
  uint8_t *c1 = ct;
  uint8_t *c2 = ct + 21504U;
  uint16_t bp_matrix[10752U] = { 0U };
  KRML_CHECK_SIZE(sizeof (uint16_t), 1806336U);
  uint16_t a_matrix[1806336U] = { 0U };
  Hacl_Impl_Frodo_Params_frodo_gen_matrix(Spec_Frodo_Params_SHAKE128, 1344U, seed_a, a_matrix);
  Hacl_Impl_Matrix_matrix_mul(8U, 1344U, 1344U, sp_matrix, a_matrix, bp_matrix);
  Hacl_Impl_Matrix_matrix_add(8U, 1344U, bp_matrix, ep_matrix);
  Hacl_Impl_Frodo_Pack_frodo_pack(8U, 1344U, 16U, bp_matrix, c1);
  uint16_t v_matrix[64U] = { 0U };
  uint16_t b_matrix[10752U] = { 0U };
  Hacl_Impl_Frodo_Pack_frodo_unpack(1344U, 8U, 16U, b, b_matrix);
  Hacl_Impl_Matrix_matrix_mul(8U, 1344U, 8U, sp_matrix, b_matrix, v_matrix);
  Hacl_Impl_Matrix_matrix_add(8U, 8U, v_matrix, epp_matrix);
  uint16_t mu_encode[64U] = { 0U };
  Hacl_Impl_Frodo_Encode_frodo_key_encode(16U, 4U, 8U, coins, mu_encode);
  Hacl_Impl_Matrix_matrix_add(8U, 8U, v_matrix, mu_encode);
  Lib_Memzero0_memzero(mu_encode, 64U, uint16_t, void *);
  Hacl_Impl_Frodo_Pack_frodo_pack(8U, 8U, 16U, v_matrix, c2);
  Lib_Memzero0_memzero(v_matrix, 64U, uint16_t, void *);
  Lib_Memzero0_memzero(sp_matrix, 10752U, uint16_t, void *);
  Lib_Memzero0_memzero(ep_matrix, 10752U, uint16_t, void *);
  Lib_Memzero0_memzero(epp_matrix, 64U, uint16_t, void *);
  uint32_t ss_init_len = 21664U;
  KRML_CHECK_SIZE(sizeof (uint8_t), ss_init_len);
  uint8_t shake_input_ss[ss_init_len];
  memset(shake_input_ss, 0U, ss_init_len * sizeof (uint8_t));
  memcpy(shake_input_ss, ct, 21632U * sizeof (uint8_t));
  memcpy(shake_input_ss + 21632U, k, 32U * sizeof (uint8_t));
  Hacl_Hash_SHA3_shake256(ss, 32U, shake_input_ss, ss_init_len);
  Lib_Memzero0_memzero(shake_input_ss, ss_init_len, uint8_t, void *);
  Lib_Memzero0_memzero(seed_se_k, 64U, uint8_t, void *);
  Lib_Memzero0_memzero(coins, 32U, uint8_t, void *);
  return 0U;
}